

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O2

string * __thiscall
nuraft::raft_server::get_aux_abi_cxx11_
          (string *__return_storage_ptr__,raft_server *this,int32 srv_id)

{
  ptr<srv_config> s_conf;
  ptr<cluster_config> c_conf;
  undefined1 local_38 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  get_config((raft_server *)(local_38 + 0x10));
  cluster_config::get_server((cluster_config *)local_38,local_38._16_4_);
  if (local_38._0_8_ == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(local_38._0_8_ + 0x28))
    ;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  return __return_storage_ptr__;
}

Assistant:

std::string raft_server::get_aux(int32 srv_id) const {
    ptr<cluster_config> c_conf = get_config();
    ptr<srv_config> s_conf = c_conf->get_server(srv_id);
    if (!s_conf) return std::string();

    return s_conf->get_aux();
}